

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Limiter.cpp
# Opt level: O0

string * __thiscall
ninx::lexer::token::Limiter::dump_abi_cxx11_(string *__return_storage_ptr__,Limiter *this)

{
  allocator<char> local_6a;
  undefined1 local_69;
  undefined1 *local_68;
  undefined8 local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Limiter *local_18;
  Limiter *this_local;
  
  local_69 = (this->super_Token).field_0xc;
  local_68 = &local_69;
  local_60 = 1;
  local_18 = this;
  this_local = (Limiter *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,local_68,local_60,&local_6a);
  std::operator+(&local_38,"LIMITER: \'",&local_58);
  std::operator+(__return_storage_ptr__,&local_38,"\'");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_6a);
  return __return_storage_ptr__;
}

Assistant:

std::string ninx::lexer::token::Limiter::dump() const {
    return "LIMITER: '" + std::string{ this->limiter } + "'";
}